

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_vec_neg32_i64_mips64el(TCGContext_conflict6 *tcg_ctx,TCGv_i64 d,TCGv_i64 b)

{
  TCGTemp *ts;
  TCGTemp *ts_00;
  uintptr_t o;
  
  ts = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
  ts_00 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_andi_i64_mips64el(tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),b,-0x100000000);
  tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_neg_i64,(TCGArg)ts_00,(TCGArg)(b + (long)tcg_ctx));
  tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_neg_i64,(TCGArg)ts,(TCGArg)ts);
  tcg_gen_deposit_i64_mips64el
            (tcg_ctx,d,(TCGv_i64)((long)ts - (long)tcg_ctx),(TCGv_i64)((long)ts_00 - (long)tcg_ctx),
             0,0x20);
  tcg_temp_free_internal_mips64el(tcg_ctx,ts);
  tcg_temp_free_internal_mips64el(tcg_ctx,ts_00);
  return;
}

Assistant:

void tcg_gen_vec_neg32_i64(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 b)
{
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_andi_i64(tcg_ctx, t1, b, ~0xffffffffull);
    tcg_gen_neg_i64(tcg_ctx,t2, b);
    tcg_gen_neg_i64(tcg_ctx,t1, t1);
    tcg_gen_deposit_i64(tcg_ctx, d, t1, t2, 0, 32);

    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t2);
}